

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall
LLVMBC::SwitchInst::SwitchInst
          (SwitchInst *this,Value *cond_,BasicBlock *default_block_,uint num_cases)

{
  Type *pTVar1;
  LLVMContext *context;
  
  pTVar1 = Value::getType(cond_);
  context = Type::getContext(pTVar1);
  pTVar1 = Type::getVoidTy(context);
  Value::Value((Value *)this,pTVar1,Switch);
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Instruction).attachments._M_h._M_buckets =
       &(this->super_Instruction).attachments._M_h._M_single_bucket;
  (this->super_Instruction).attachments._M_h._M_bucket_count = 1;
  (this->super_Instruction).attachments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_Instruction).attachments._M_h._M_element_count = 0;
  (this->super_Instruction).attachments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_Instruction).attachments._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_Instruction).attachments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->cond = cond_;
  this->default_block = default_block_;
  (this->cases).
  super__Vector_base<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cases).
  super__Vector_base<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cases).
  super__Vector_base<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Instruction).is_terminator = true;
  std::vector<LLVMBC::SwitchInst::Case,_dxil_spv::ThreadLocalAllocator<LLVMBC::SwitchInst::Case>_>::
  reserve(&this->cases,(ulong)num_cases);
  return;
}

Assistant:

SwitchInst::SwitchInst(Value *cond_, BasicBlock *default_block_, unsigned num_cases)
    : Instruction(Type::getVoidTy(cond_->getType()->getContext()), ValueKind::Switch)
    , cond(cond_)
    , default_block(default_block_)
{
	set_terminator();
	cases.reserve(num_cases);
}